

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O3

string_view __thiscall
libtorrent::bdecode_node::list_string_value_at(bdecode_node *this,int i,string_view default_val)

{
  bdecode_token bVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  size_t sVar5;
  char *pcVar6;
  string_view sVar7;
  bdecode_node n;
  bdecode_node local_58;
  
  pcVar6 = default_val._M_str;
  sVar5 = default_val._M_len;
  list_at(&local_58,this,i);
  lVar4 = (long)local_58.m_token_idx;
  if (lVar4 != -1) {
    bVar1 = local_58.m_root_tokens[lVar4];
    uVar2 = bVar1._0_4_;
    uVar3 = (uint)((ulong)bVar1 >> 0x1d) & 7;
    if ((uVar3 == 5) || (uVar3 == 3)) {
      uVar3 = (bVar1._4_4_ >> 0x1d) + (uint)((uVar2 & 0xe0000000) != 0x60000000) * 8;
      sVar5 = (size_t)(int)(((*(uint *)(local_58.m_root_tokens + lVar4 + 1) & 0x1fffffff) -
                            ((uVar2 & 0x1fffffff) + uVar3)) + -2);
      pcVar6 = local_58.m_buffer + (ulong)uVar3 + (ulong)(uVar2 & 0x1fffffff) + 2;
    }
  }
  if (local_58.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  sVar7._M_str = pcVar6;
  sVar7._M_len = sVar5;
  return sVar7;
}

Assistant:

string_view bdecode_node::list_string_value_at(int i
		, string_view default_val) const
	{
		bdecode_node const n = list_at(i);
		if (n.type() != bdecode_node::string_t) return default_val;
		return n.string_value();
	}